

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O3

void Assimp::FBX::ParseVectorDataArray(vector<float,_std::allocator<float>_> *out,Element *el)

{
  pointer *ppfVar1;
  Token *t;
  pointer ppTVar2;
  iterator iVar3;
  char *end;
  size_t __n;
  Scope *sc;
  Element *pEVar4;
  Element *in_R9;
  long lVar5;
  _Alloc_hider _Var6;
  pointer ppTVar7;
  float fVar8;
  char type;
  vector<char,_std::allocator<char>_> buff;
  char *data;
  uint32_t count;
  byte local_69;
  string local_68;
  float local_44;
  char *local_40;
  uint32_t local_34;
  
  std::vector<float,_std::allocator<float>_>::resize(out,0);
  ppTVar7 = (el->tokens).
            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar7 ==
      (el->tokens).
      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"unexpected empty element","");
    anon_unknown.dwarf_106f2e2::ParseError(&local_68,el);
  }
  t = *ppTVar7;
  if (t->column == 0xffffffff) {
    local_40 = t->sbegin;
    end = t->send;
    anon_unknown_20::ReadBinaryDataArrayHead(&local_40,end,(char *)&local_69,&local_34,el);
    if (local_34 != 0) {
      if ((local_69 & 0xfd) != 100) {
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"expected float or double array (binary)","");
        anon_unknown.dwarf_106f2e2::ParseError(&local_68,el);
      }
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length = 0;
      local_68.field_2._M_allocated_capacity = 0;
      anon_unknown_20::ReadBinaryDataArray
                (local_69,local_34,&local_40,end,(vector<char,_std::allocator<char>_> *)&local_68,
                 in_R9);
      _Var6._M_p = local_68._M_dataplus._M_p;
      if (local_69 == 0x66) {
        do {
          iVar3._M_current =
               (out->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (out->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                      ((vector<float,std::allocator<float>> *)out,iVar3,(float *)_Var6._M_p);
          }
          else {
            *iVar3._M_current = *(float *)_Var6._M_p;
            ppfVar1 = &(out->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppfVar1 = *ppfVar1 + 1;
          }
          local_34 = local_34 - 1;
          _Var6._M_p = (pointer)((long)_Var6._M_p + 4);
        } while (local_34 != 0);
      }
      else if (local_69 == 100) {
        lVar5 = 0;
        do {
          local_44 = (float)*(double *)(_Var6._M_p + lVar5 * 8);
          std::vector<float,_std::allocator<float>_>::emplace_back<float>(out,&local_44);
          lVar5 = lVar5 + 1;
        } while (local_34 != (uint32_t)lVar5);
      }
      if ((float *)local_68._M_dataplus._M_p != (float *)0x0) {
        operator_delete(local_68._M_dataplus._M_p,
                        local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p);
      }
    }
  }
  else {
    __n = ParseTokenAsDim(t);
    std::vector<float,_std::allocator<float>_>::reserve(out,__n);
    sc = GetRequiredScope(el);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"a","");
    pEVar4 = GetRequiredElement(sc,&local_68,el);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    ppTVar7 = (pEVar4->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppTVar2 = (pEVar4->tokens).
              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppTVar7 != ppTVar2) {
      do {
        fVar8 = ParseTokenAsFloat(*ppTVar7);
        local_68._M_dataplus._M_p._0_4_ = fVar8;
        iVar3._M_current =
             (out->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (out->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
            ._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)out,iVar3,(float *)&local_68);
        }
        else {
          *iVar3._M_current = fVar8;
          ppfVar1 = &(out->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppfVar1 = *ppfVar1 + 1;
        }
        ppTVar7 = ppTVar7 + 1;
      } while (ppTVar7 != ppTVar2);
    }
  }
  return;
}

Assistant:

void ParseVectorDataArray(std::vector<float>& out, const Element& el)
{
    out.resize( 0 );
    const TokenList& tok = el.Tokens();
    if(tok.empty()) {
        ParseError("unexpected empty element",&el);
    }

    if(tok[0]->IsBinary()) {
        const char* data = tok[0]->begin(), *end = tok[0]->end();

        char type;
        uint32_t count;
        ReadBinaryDataArrayHead(data, end, type, count, el);

        if(!count) {
            return;
        }

        if (type != 'd' && type != 'f') {
            ParseError("expected float or double array (binary)",&el);
        }

        std::vector<char> buff;
        ReadBinaryDataArray(type, count, data, end, buff, el);

        ai_assert(data == end);
        ai_assert(buff.size() == count * (type == 'd' ? 8 : 4));

        if (type == 'd') {
            const double* d = reinterpret_cast<const double*>(&buff[0]);
            for (unsigned int i = 0; i < count; ++i, ++d) {
                out.push_back(static_cast<float>(*d));
            }
        }
        else if (type == 'f') {
            const float* f = reinterpret_cast<const float*>(&buff[0]);
            for (unsigned int i = 0; i < count; ++i, ++f) {
                out.push_back(*f);
            }
        }

        return;
    }

    const size_t dim = ParseTokenAsDim(*tok[0]);

    // see notes in ParseVectorDataArray()
    out.reserve(dim);

    const Scope& scope = GetRequiredScope(el);
    const Element& a = GetRequiredElement(scope,"a",&el);

    for (TokenList::const_iterator it = a.Tokens().begin(), end = a.Tokens().end(); it != end; ) {
        const float ival = ParseTokenAsFloat(**it++);
        out.push_back(ival);
    }
}